

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mems.cpp
# Opt level: O1

void __thiscall Mems::print_informations(Mems *this)

{
  ostream *poVar1;
  pointer pMVar2;
  char local_3b [11];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"",0);
  local_3b[6] = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_3b + 6,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"MEMS-Informations",0x11)
  ;
  local_3b[5] = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_3b + 5,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"",0);
  local_3b[4] = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_3b + 4,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"_mems_mirrors.size() = ",0x17);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  local_3b[3] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3b + 3,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"_mems_mirrors_randomrasterized.size() = ",0x28);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  local_3b[2] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3b + 2,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"",0);
  local_3b[1] = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_3b + 1,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"_mems_mirrors content: ",0x17);
  local_3b[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_3b,1);
  pMVar2 = (this->_mems_mirrors_multi).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pMVar2 != (this->_mems_mirrors_multi).super__Vector_base<Mirror,_std::allocator<Mirror>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"mirror id: ",0xb);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pMVar2->id);
      local_3b[10] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3b + 10,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"mirror pos: x ",0xe)
      ;
      poVar1 = std::ostream::_M_insert<double>((pMVar2->_position).x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ,   y ",7);
      poVar1 = std::ostream::_M_insert<double>((pMVar2->_position).y);
      local_3b[9] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3b + 9,1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"displayed_sample pos: x ",0x18);
      poVar1 = std::ostream::_M_insert<double>((pMVar2->_displayed_sample).x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ,   y ",7);
      poVar1 = std::ostream::_M_insert<double>((pMVar2->_displayed_sample).y);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ,   dist: ",0xb);
      poVar1 = std::ostream::_M_insert<double>((pMVar2->_displayed_sample).dis);
      local_3b[8] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3b + 8,1);
      local_3b[7] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_3b + 7,1);
      pMVar2 = pMVar2 + 1;
    } while (pMVar2 != (this->_mems_mirrors_multi).
                       super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void Mems::print_informations(){
  std::cout << "" << '\n';
  std::cout << "MEMS-Informations" << '\n';
  std::cout << "" << '\n';
  std::cout << "_mems_mirrors.size() = "<< _mems_mirrors.size() << '\n';
  std::cout << "_mems_mirrors_randomrasterized.size() = "<< _mems_mirrors_randomrasterized.size() << '\n';
  std::cout << "" << '\n';
  std::cout << "_mems_mirrors content: " << '\n';
  for( auto it = std::begin(_mems_mirrors_multi); it!= std::end(_mems_mirrors_multi); ++it){
    std::cout <<"mirror id: " << it->id <<'\n';
    std::cout <<"mirror pos: x " << it->_position.x<<" ,   y " << it->_position.y<<'\n';
    std::cout <<"displayed_sample pos: x " << it->_displayed_sample.x<<" ,   y " << it->_displayed_sample.y<<" ,   dist: " << it->_displayed_sample.dis<<'\n';
//    std::cout <<"mirror amount of matching samples " << it->_ammount_of_matching_samples<<'\n';
    std::cout <<'\n';
    for(auto samp = std::begin(it->_matching_samples); samp != std::begin(it->_matching_samples); ++samp){
      std::cout <<" x " << samp->x<<" ,   y " << samp->y<<'\n';

    }
  }

}